

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_DefinePropertyValue(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  int iVar1;
  JSValue getter;
  JSValue setter;
  int iVar2;
  JSRefCountHeader *p;
  uint uStack_3c;
  uint uStack_2c;
  
  getter.tag = 3;
  getter.u.ptr = (void *)((ulong)uStack_2c << 0x20);
  setter.tag = 3;
  setter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
  iVar2 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,flags | 0x2700);
  if ((0xfffffff4 < (uint)val.tag) &&
     (iVar1 = *val.u.ptr, *(int *)val.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,val);
  }
  return iVar2;
}

Assistant:

int JS_DefinePropertyValue(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    int ret;
    ret = JS_DefineProperty(ctx, this_obj, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                            flags | JS_PROP_HAS_VALUE | JS_PROP_HAS_CONFIGURABLE | JS_PROP_HAS_WRITABLE | JS_PROP_HAS_ENUMERABLE);
    JS_FreeValue(ctx, val);
    return ret;
}